

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

bool __thiscall google::protobuf::io::Tokenizer::TryConsumeNewline(Tokenizer *this)

{
  bool bVar1;
  
  if (this->report_whitespace_ != true) {
    return false;
  }
  if ((this->report_newlines_ == true) && (bVar1 = TryConsume(this,'\n'), bVar1)) {
    (this->current_).type = TYPE_NEWLINE;
    return true;
  }
  return false;
}

Assistant:

bool Tokenizer::TryConsumeNewline() {
  if (!report_whitespace_ || !report_newlines_) {
    return false;
  }
  if (TryConsume('\n')) {
    current_.type = TYPE_NEWLINE;
    return true;
  }
  return false;
}